

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_event::
unlock_and_signal_one<asio::detail::scoped_lock<asio::detail::posix_mutex>>
          (posix_event *this,scoped_lock<asio::detail::posix_mutex> *lock)

{
  ulong uVar1;
  bool bVar2;
  scoped_lock<asio::detail::posix_mutex> *in_RSI;
  pthread_cond_t *in_RDI;
  bool have_waiters;
  
  bVar2 = scoped_lock<asio::detail::posix_mutex>::locked(in_RSI);
  if (!bVar2) {
    __assert_fail("lock.locked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/thirdparty/asio/detail/posix_event.hpp"
                  ,0x41,
                  "void asio::detail::posix_event::unlock_and_signal_one(Lock &) [Lock = asio::detail::scoped_lock<asio::detail::posix_mutex>]"
                 );
  }
  in_RDI[1].__align = in_RDI[1].__align | 1;
  uVar1 = in_RDI[1].__align;
  scoped_lock<asio::detail::posix_mutex>::unlock
            ((scoped_lock<asio::detail::posix_mutex> *)&in_RDI->__data);
  if (1 < uVar1) {
    pthread_cond_signal(in_RDI);
  }
  return;
}

Assistant:

void unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    bool have_waiters = (state_ > 1);
    lock.unlock();
    if (have_waiters)
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
  }